

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testFromChar(String *str)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  char *__s1;
  String *str_local;
  
  sVar3 = cm::String::size(str);
  if (sVar3 == 1) {
    __s1 = cm::String::data(str);
    iVar2 = strncmp(__s1,"a",1);
    if (iVar2 == 0) {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        str_local._7_1_ = true;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(str.is_stable()) failed on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xcf);
        std::operator<<(poVar4,"\n");
        str_local._7_1_ = false;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(std::strncmp(str.data(), \"a\", 1) == 0) failed on line "
                              );
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xce);
      std::operator<<(poVar4,"\n");
      str_local._7_1_ = false;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 1) failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xcd);
    std::operator<<(poVar4,"\n");
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

static bool testFromChar(cm::String const& str)
{
  ASSERT_TRUE(str.size() == 1);
  ASSERT_TRUE(std::strncmp(str.data(), "a", 1) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}